

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IndexType type;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  undefined8 *puVar5;
  DrawTest *this_00;
  long *extraout_RAX;
  IndexType type_00;
  IndexType type_01;
  undefined8 uVar7;
  ulong uVar8;
  long lVar9;
  string desc;
  string iterationDesc;
  string name;
  DrawTestSpec spec;
  string local_2b0;
  string local_290;
  long *local_270;
  undefined8 local_268;
  long local_260;
  undefined8 uStack_258;
  long local_250;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  ulong *local_228;
  long local_220;
  ulong local_218 [2];
  undefined *local_208;
  IndexGroup *local_200;
  DrawTestSpec local_1f8;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198 [12];
  ios_base local_138 [264];
  long *plVar6;
  
  gls::DrawTestSpec::DrawTestSpec(&local_1f8);
  genBasicSpec(&local_1f8,this->m_method);
  local_1f8.indexStorage = STORAGE_BUFFER;
  paVar2 = &local_290.field_2;
  local_250 = 0;
  local_208 = &DAT_009cbaa0;
  local_200 = this;
  do {
    local_1a8 = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"index_","");
    type = *(IndexType *)(&DAT_009cbaa0 + local_250 * 0x10);
    gls::DrawTestSpec::indexTypeToString_abi_cxx11_(&local_2b0,(DrawTestSpec *)(ulong)type,type_00);
    uVar8 = 0xf;
    if (local_1a8 != local_198) {
      uVar8 = local_198[0];
    }
    if (uVar8 < local_2b0._M_string_length + local_1a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar7 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_2b0._M_string_length + local_1a0) goto LAB_0064d6b0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_0064d6b0:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_2b0._M_dataplus._M_p)
      ;
    }
    local_270 = &local_260;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_260 = *plVar6;
      uStack_258 = puVar5[3];
    }
    else {
      local_260 = *plVar6;
      local_270 = (long *)*puVar5;
    }
    local_268 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    local_1a8 = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"index ","");
    gls::DrawTestSpec::indexTypeToString_abi_cxx11_(&local_290,(DrawTestSpec *)(ulong)type,type_01);
    uVar8 = 0xf;
    if (local_1a8 != local_198) {
      uVar8 = local_198[0];
    }
    if (uVar8 < local_290._M_string_length + local_1a0) {
      uVar7 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar2) {
        uVar7 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar7 < local_290._M_string_length + local_1a0) goto LAB_0064d7c0;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_1a8);
    }
    else {
LAB_0064d7c0:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    puVar1 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1) {
      local_2b0.field_2._M_allocated_capacity = *puVar1;
      local_2b0.field_2._8_8_ = puVar5[3];
    }
    else {
      local_2b0.field_2._M_allocated_capacity = *puVar1;
      local_2b0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_2b0._M_string_length = puVar5[1];
    *puVar5 = puVar1;
    puVar5[1] = 0;
    *(undefined1 *)puVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
    }
    this_00 = (DrawTest *)operator_new(0x138);
    gls::DrawTest::DrawTest
              (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,(char *)local_270,
               local_2b0._M_dataplus._M_p);
    lVar9 = 1;
    local_1f8.indexType = type;
    do {
      iVar4 = *(int *)(local_208 + lVar9 * 4);
      if (iVar4 == -1) break;
      local_248 = local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"first vertex ","");
      iVar3 = gls::DrawTestSpec::indexTypeSize(type);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar4 / iVar3);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar8 = 0xf;
      if (local_248 != local_238) {
        uVar8 = local_238[0];
      }
      if (uVar8 < (ulong)(local_220 + local_240)) {
        uVar8 = 0xf;
        if (local_228 != local_218) {
          uVar8 = local_218[0];
        }
        if (uVar8 < (ulong)(local_220 + local_240)) goto LAB_0064d97f;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,(ulong)local_248);
      }
      else {
LAB_0064d97f:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_228);
      }
      puVar1 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1) {
        local_290.field_2._M_allocated_capacity = *puVar1;
        local_290.field_2._8_8_ = puVar5[3];
        local_290._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar1;
        local_290._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_290._M_string_length = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      if (local_228 != local_218) {
        operator_delete(local_228,local_218[0] + 1);
      }
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      local_1f8.indexPointerOffset = iVar4;
      gls::DrawTest::addIteration(this_00,&local_1f8,local_290._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != paVar2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    this = local_200;
    tcu::TestNode::addChild((TestNode *)local_200,(TestNode *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    plVar6 = &local_260;
    if (local_270 != plVar6) {
      operator_delete(local_270,local_260 + 1);
      plVar6 = extraout_RAX;
    }
    iVar4 = (int)plVar6;
    local_250 = local_250 + 1;
    local_208 = local_208 + 0x10;
    if (local_250 == 3) {
      if (local_1f8.attribs.
          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1f8.attribs.
                        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f8.attribs.
                              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        iVar4 = extraout_EAX;
      }
      return iVar4;
    }
  } while( true );
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::IndexType	type;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::INDEXTYPE_BYTE,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::INDEXTYPE_SHORT,	{ 0, 2, -1 } },
		{ gls::DrawTestSpec::INDEXTYPE_INT,		{ 0, 4, -1 } },
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	spec.indexStorage = gls::DrawTestSpec::STORAGE_BUFFER;

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&	indexTest	= tests[testNdx];

		const std::string	name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string	desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		gls::DrawTest*		test		= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.indexType			= indexTest.type;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("first vertex ") + de::toString(indexTest.offsets[iterationNdx] / gls::DrawTestSpec::indexTypeSize(indexTest.type));
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		addChild(test);
	}
}